

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

shared_ptr<QPDF> qpdf_c_get_qpdf(qpdf_data qpdf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  shared_ptr<QPDF> sVar1;
  
  std::__shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2> *)qpdf,in_RSI);
  sVar1.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)qpdf;
  return (shared_ptr<QPDF>)sVar1.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDF>
qpdf_c_get_qpdf(qpdf_data qpdf)
{
    return qpdf->qpdf;
}